

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.h
# Opt level: O2

int __thiscall QWidget::y(QWidget *this)

{
  uint uVar1;
  QWidgetData *pQVar2;
  int iVar3;
  QRect QVar4;
  
  pQVar2 = this->data;
  uVar1 = (pQVar2->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  if ((uVar1 & 0xff) == 9 || (uVar1 & 1) == 0) {
    iVar3 = (pQVar2->crect).y1.m_i;
  }
  else {
    iVar3 = (pQVar2->crect).y1.m_i;
    QVar4 = QWidgetPrivate::frameStrut(*(QWidgetPrivate **)&this->field_0x8);
    iVar3 = iVar3 - QVar4.y1.m_i;
  }
  return iVar3;
}

Assistant:

inline Qt::WindowType QWidget::windowType() const
{ return static_cast<Qt::WindowType>((data->window_flags & Qt::WindowType_Mask).toInt()); }